

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O0

void flatbuffers::kotlin::KotlinKMPGenerator::GenerateFun
               (CodeWriter *writer,string *name,string *params,string *returnType,
               function<void_()> *body,bool gen_jvmstatic)

{
  string *psVar1;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  byte local_e2;
  allocator<char> local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_59;
  string local_58;
  byte local_32;
  byte local_31;
  bool noreturn;
  function<void_()> *pfStack_30;
  bool gen_jvmstatic_local;
  function<void_()> *body_local;
  string *returnType_local;
  string *params_local;
  string *name_local;
  CodeWriter *writer_local;
  
  local_31 = gen_jvmstatic;
  pfStack_30 = body;
  body_local = (function<void_()> *)returnType;
  returnType_local = params;
  params_local = name;
  name_local = (string *)writer;
  local_32 = std::__cxx11::string::empty();
  psVar1 = name_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"name",&local_59);
  CodeWriter::SetValue((CodeWriter *)psVar1,&local_58,params_local);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  psVar1 = name_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"params",&local_91);
  CodeWriter::SetValue((CodeWriter *)psVar1,&local_90,returnType_local);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  psVar1 = name_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"return_type",&local_b9);
  local_e2 = 0;
  if ((local_32 & 1) == 0) {
    std::operator+(&local_e0,": ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)body_local);
  }
  else {
    std::allocator<char>::allocator();
    local_e2 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"",&local_e1);
  }
  CodeWriter::SetValue((CodeWriter *)psVar1,&local_b8,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  if ((local_e2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_e1);
  }
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  GenerateJvmStaticAnnotation((CodeWriter *)name_local,(bool)(local_31 & 1));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"fun {{name}}({{params}}) {{return_type}} {",&local_109);
  CodeWriter::operator+=((CodeWriter *)name_local,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  CodeWriter::IncrementIdentLevel((CodeWriter *)name_local);
  std::function<void_()>::operator()(pfStack_30);
  CodeWriter::DecrementIdentLevel((CodeWriter *)name_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"}",&local_131);
  CodeWriter::operator+=((CodeWriter *)name_local,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  return;
}

Assistant:

static void GenerateFun(CodeWriter &writer, const std::string &name,
                          const std::string &params,
                          const std::string &returnType,
                          const std::function<void()> &body,
                          bool gen_jvmstatic = false) {
    // Generates Kotlin function
    // e.g.:
    // fun path(j: Int): Vec3 {
    //     return path(Vec3(), j)
    // }
    auto noreturn = returnType.empty();
    writer.SetValue("name", name);
    writer.SetValue("params", params);
    writer.SetValue("return_type", noreturn ? "" : ": " + returnType);
    GenerateJvmStaticAnnotation(writer, gen_jvmstatic);
    writer += "fun {{name}}({{params}}) {{return_type}} {";
    writer.IncrementIdentLevel();
    body();
    writer.DecrementIdentLevel();
    writer += "}";
  }